

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFormatUtil.hpp
# Opt level: O1

ostream * __thiscall tcu::Format::Bitfield<16UL>::toStream(Bitfield<16UL> *this,ostream *stream)

{
  char *__s;
  size_t sVar1;
  BitDesc *pBVar2;
  deUint64 dVar3;
  Hex<4UL> local_38;
  
  dVar3 = this->m_value;
  pBVar2 = this->m_begin;
  if (pBVar2 != this->m_end) {
    do {
      if ((pBVar2->bit & dVar3) != 0) {
        if (dVar3 != this->m_value) {
          std::__ostream_insert<char,std::char_traits<char>>(stream,"|",1);
        }
        __s = pBVar2->name;
        if (__s == (char *)0x0) {
          std::ios::clear((int)stream + (int)*(undefined8 *)(*(long *)stream + -0x18));
        }
        else {
          sVar1 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>(stream,__s,sVar1);
        }
        dVar3 = dVar3 ^ pBVar2->bit;
      }
      pBVar2 = pBVar2 + 1;
    } while (pBVar2 != this->m_end);
  }
  if (dVar3 != 0) {
    if (dVar3 != this->m_value) {
      std::__ostream_insert<char,std::char_traits<char>>(stream,"|",1);
    }
    local_38.value = dVar3;
    Hex<4UL>::toStream(&local_38,stream);
  }
  return stream;
}

Assistant:

std::ostream& toStream (std::ostream& stream)
	{
		deUint64 bitsLeft = m_value;
		for (const BitDesc* curDesc = m_begin; curDesc != m_end; curDesc++)
		{
			if (curDesc->bit & bitsLeft)
			{
				if (bitsLeft != m_value)
					stream << "|";
				stream << curDesc->name;
				bitsLeft ^= curDesc->bit;
			}
		}

		if (bitsLeft != 0)
		{
			if (bitsLeft != m_value)
				stream << "|";
			stream << Hex<BitfieldSize/4>(bitsLeft);
		}

		return stream;
	}